

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::__cxx11::string>>
::_find_key<std::__cxx11::string>
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          size_t hashval)

{
  char *pcVar1;
  uint uVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  __type _Var19;
  uint uVar20;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  __m128i match;
  undefined1 auVar27 [16];
  probe_seq<16UL> seq;
  char cVar21;
  char cVar24;
  char cVar25;
  char cVar26;
  
  if (*(long *)this != 0) {
    raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::probe(&seq,(raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this,hashval);
    auVar22 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
    auVar22 = pshuflw(auVar22,auVar22,0);
    while( true ) {
      pcVar1 = (char *)(*(long *)this + seq.offset_);
      cVar3 = *pcVar1;
      cVar4 = pcVar1[1];
      cVar5 = pcVar1[2];
      cVar6 = pcVar1[3];
      cVar7 = pcVar1[4];
      cVar8 = pcVar1[5];
      cVar9 = pcVar1[6];
      cVar10 = pcVar1[7];
      cVar11 = pcVar1[8];
      cVar12 = pcVar1[9];
      cVar13 = pcVar1[10];
      cVar14 = pcVar1[0xb];
      cVar15 = pcVar1[0xc];
      cVar16 = pcVar1[0xd];
      cVar17 = pcVar1[0xe];
      cVar18 = pcVar1[0xf];
      cVar21 = auVar22[0];
      auVar23[0] = -(cVar21 == cVar3);
      cVar24 = auVar22[1];
      auVar23[1] = -(cVar24 == cVar4);
      cVar25 = auVar22[2];
      auVar23[2] = -(cVar25 == cVar5);
      cVar26 = auVar22[3];
      auVar23[3] = -(cVar26 == cVar6);
      auVar23[4] = -(cVar21 == cVar7);
      auVar23[5] = -(cVar24 == cVar8);
      auVar23[6] = -(cVar25 == cVar9);
      auVar23[7] = -(cVar26 == cVar10);
      auVar23[8] = -(cVar21 == cVar11);
      auVar23[9] = -(cVar24 == cVar12);
      auVar23[10] = -(cVar25 == cVar13);
      auVar23[0xb] = -(cVar26 == cVar14);
      auVar23[0xc] = -(cVar21 == cVar15);
      auVar23[0xd] = -(cVar24 == cVar16);
      auVar23[0xe] = -(cVar25 == cVar17);
      auVar23[0xf] = -(cVar26 == cVar18);
      for (uVar20 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(auVar23[0xf] >> 7) << 0xf); uVar20 != 0;
          uVar20 = uVar20 - 1 & uVar20) {
        uVar2 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        _Var19 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((seq.offset_ + uVar2 & seq.mask_) * 0x20 + *(long *)(this + 8))
                                 ,key);
        if (_Var19) {
          return uVar2 + seq.offset_ & seq.mask_;
        }
      }
      auVar27[0] = -(cVar3 == -0x80);
      auVar27[1] = -(cVar4 == -0x80);
      auVar27[2] = -(cVar5 == -0x80);
      auVar27[3] = -(cVar6 == -0x80);
      auVar27[4] = -(cVar7 == -0x80);
      auVar27[5] = -(cVar8 == -0x80);
      auVar27[6] = -(cVar9 == -0x80);
      auVar27[7] = -(cVar10 == -0x80);
      auVar27[8] = -(cVar11 == -0x80);
      auVar27[9] = -(cVar12 == -0x80);
      auVar27[10] = -(cVar13 == -0x80);
      auVar27[0xb] = -(cVar14 == -0x80);
      auVar27[0xc] = -(cVar15 == -0x80);
      auVar27[0xd] = -(cVar16 == -0x80);
      auVar27[0xe] = -(cVar17 == -0x80);
      auVar27[0xf] = -(cVar18 == -0x80);
      if ((((((((((((((((auVar27 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar27 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar27 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar27 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar27 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar27 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar27 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar27 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar27 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar27 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar27 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar27 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar18 == -0x80)
      break;
      seq.index_ = seq.index_ + 0x10;
      seq.offset_ = seq.index_ + seq.offset_ & seq.mask_;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t _find_key(const K& PHMAP_RESTRICT key, size_t hashval) {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return (size_t)-1;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                                          EqualElement<K>{key, eq_ref()},
                                          PolicyTraits::element(slots_ + seq.offset((size_t)i)))))
                    return seq.offset((size_t)i);
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) break;
            seq.next();
        }
        return (size_t)-1;
    }